

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall llbuild::basic::SerialQueue::async(SerialQueue *this,function<void_()> *fn)

{
  SerialQueueImpl *this_00;
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  this_00 = (SerialQueueImpl *)this->impl;
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = (_Invoker_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Var1 = (fn->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_38,(_Any_data *)fn,__clone_functor);
    p_Stack_20 = fn->_M_invoker;
    local_28 = (fn->super__Function_base)._M_manager;
  }
  anon_unknown.dwarf_24db74::SerialQueueImpl::async(this_00,(function<void_()> *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void SerialQueue::async(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->async(fn);
}